

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

void do_abort_change_class_name_proc(Am_Object *inter)

{
  Am_Value *pAVar1;
  Am_Object_Method_Type *pAVar2;
  char cVar3;
  Am_String new_name;
  Am_Object proto;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object_Method local_28;
  Am_Object local_18;
  
  Am_Object::Get_Prototype();
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_18,0xc9);
  Am_Object_Method::Am_Object_Method(&local_28,pAVar1);
  Am_Object::Am_Object(&local_30,inter);
  (*local_28.Call)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)inter,0x16c);
  Am_String::Am_String((Am_String *)&local_28,pAVar1);
  cVar3 = Am_String::operator==((Am_String *)&local_28,"");
  if (cVar3 != '\0') {
    Am_Object::Am_Object(&local_38,(Am_Object *)&Am_No_Object);
    Am_Beep((Am_Object_Data *)&local_38);
    Am_Object::~Am_Object(&local_38);
    pAVar2 = do_delete_class.Call;
    Am_Object::Am_Object(&local_40,inter);
    (*pAVar2)((Am_Object_Data *)&local_40);
    Am_Object::~Am_Object(&local_40);
  }
  Am_String::~Am_String((Am_String *)&local_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_abort_change_class_name,
                 (Am_Object inter))
{
  // call prototype's method
  Am_Object proto = inter.Get_Prototype();
  Am_Object_Method(proto.Get(Am_ABORT_DO_METHOD)).Call(inter);

  Am_String new_name = inter.Get(Am_OLD_VALUE);
  if (new_name == NEW_CLASS_NAME) {
    // user was entering name for a new class, but aborted.
    // Delete the new class
    extern Am_Object_Method do_delete_class;
    Am_Beep();
    do_delete_class.Call(inter);
  }
}